

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_2::InMemoryEnv::~InMemoryEnv(InMemoryEnv *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  _Link_type in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_EnvWrapper).super_Env._vptr_Env = (_func_int **)&PTR__InMemoryEnv_01149220;
  for (p_Var2 = (this->file_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->file_map_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    FileState::Unref(*(FileState **)(p_Var2 + 2));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
              *)(this->file_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    EnvWrapper::~EnvWrapper(&this->super_EnvWrapper);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~InMemoryEnv() override {
    for (const auto& kvp : file_map_) {
      kvp.second->Unref();
    }
  }